

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::AddBuiltinCommand(cmState *this,string *name,BuiltinCommand command)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx:425:5)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx:425:5)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)command;
  AddBuiltinCommand(this,name,(Command *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void cmState::AddGlobCacheEntry(
  bool recurse, bool listDirectories, bool followSymlinks,
  const std::string& relative, const std::string& expression,
  const std::vector<std::string>& files, const std::string& variable,
  cmListFileBacktrace const& backtrace, cmMessenger* messenger)
{
  this->GlobVerificationManager->AddCacheEntry(
    recurse, listDirectories, followSymlinks, relative, expression, files,
    variable, backtrace, messenger);
}